

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O1

int __thiscall BCL::fetch_and_op<int>(BCL *this,GlobalPtr<int> ptr,int *val,atomic_op<int> *op)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  debug_error *pdVar6;
  int rv;
  BCL *local_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  MPI_Request request;
  
  local_80 = this;
  uVar2 = (**(code **)(*(long *)((long)val + *(long *)(*(long *)val + -0x28)) + 8))
                    ((long)val + *(long *)(*(long *)val + -0x28));
  uVar3 = (**(code **)(*(long *)((long)val + *(long *)(*(long *)val + -0x28)) + 8))
                    ((long)val + *(long *)(*(long *)val + -0x28));
  uVar4 = (**(code **)(*(long *)((long)val + *(long *)(*(long *)val + -0x28)) + 8))
                    ((long)val + *(long *)(*(long *)val + -0x28));
  uVar5 = (*(code *)**(undefined8 **)((long)val + *(long *)(*(long *)val + -0x28)))
                    ((long)val + *(long *)(*(long *)val + -0x28));
  iVar1 = MPI_Rget_accumulate(ptr.ptr,1,uVar2,&rv,1,uVar3,local_80,ptr.rank,1,uVar4,uVar5,win,
                              &request);
  if (iVar1 != 0) {
    pdVar6 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_78,iVar1);
    std::operator+(&local_58,"BCL fetch_and_op(): MPI_Rget_accumulate return error code ",&local_78)
    ;
    debug_error::debug_error(pdVar6,&local_58);
    __cxa_throw(pdVar6,&debug_error::typeinfo,debug_error::~debug_error);
  }
  iVar1 = MPI_Wait(&request,0);
  if (iVar1 == 0) {
    return rv;
  }
  pdVar6 = (debug_error *)__cxa_allocate_exception(0x40);
  std::__cxx11::to_string(&local_78,iVar1);
  std::operator+(&local_58,"BCL fetch_and_op(): MPI_Rget_accumulate (MPI_Wait) return error code ",
                 &local_78);
  debug_error::debug_error(pdVar6,&local_58);
  __cxa_throw(pdVar6,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

inline T fetch_and_op(const GlobalPtr <T> ptr, const T &val, const atomic_op <T> &op) {
  T rv;
  MPI_Request request;

  int error_code = MPI_Rget_accumulate(&val, 1, op.type(),
                                       &rv, 1, op.type(),
                                       ptr.rank, ptr.ptr, 1, op.type(),
                                       op.op(), BCL::win, &request);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL fetch_and_op(): MPI_Rget_accumulate return error code " + std::to_string(error_code));
          }
  )

  error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);

  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL fetch_and_op(): MPI_Rget_accumulate (MPI_Wait) return error code " + std::to_string(error_code));
          }
  )
  return rv;
}